

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O2

int Abc_AigCheckTfi_rec(Abc_Obj_t *pNode,Abc_Obj_t *pOld)

{
  uint uVar1;
  int iVar2;
  
  while( true ) {
    if (pNode == (Abc_Obj_t *)0x0) {
      return 0;
    }
    uVar1 = *(uint *)&pNode->field_0x14 & 0xf;
    if (uVar1 == 2) {
      return 0;
    }
    if (uVar1 == 5) {
      return 0;
    }
    if (pNode == pOld) break;
    iVar2 = Abc_NodeIsTravIdCurrent(pNode);
    if (iVar2 != 0) {
      return 0;
    }
    Abc_NodeSetTravIdCurrent(pNode);
    iVar2 = Abc_AigCheckTfi_rec((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],
                                pOld);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = Abc_AigCheckTfi_rec((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],
                                pOld);
    if (iVar2 != 0) {
      return 1;
    }
    pNode = (Abc_Obj_t *)(pNode->field_5).pData;
  }
  return 1;
}

Assistant:

int Abc_AigCheckTfi_rec( Abc_Obj_t * pNode, Abc_Obj_t * pOld )
{
    // check the trivial cases
    if ( pNode == NULL )
        return 0;
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    if ( pNode == pOld )
        return 1;
    // skip the visited node
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return 0;
    Abc_NodeSetTravIdCurrent( pNode );
    // check the children
    if ( Abc_AigCheckTfi_rec( Abc_ObjFanin0(pNode), pOld ) )
        return 1;
    if ( Abc_AigCheckTfi_rec( Abc_ObjFanin1(pNode), pOld ) )
        return 1;
    // check equivalent nodes
    return Abc_AigCheckTfi_rec( (Abc_Obj_t *)pNode->pData, pOld );
}